

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O3

void xmlBufferWriteQuotedString(xmlBufferPtr buf,xmlChar *string)

{
  xmlChar *pxVar1;
  int len;
  long lVar2;
  
  if (buf == (xmlBufferPtr)0x0) {
    return;
  }
  pxVar1 = xmlStrchr(string,'\"');
  if (pxVar1 == (xmlChar *)0x0) {
    pxVar1 = "\"";
  }
  else {
    pxVar1 = xmlStrchr(string,'\'');
    if (pxVar1 != (xmlChar *)0x0) {
      pxVar1 = "\"";
      xmlBufferAdd(buf,"\"",-1);
      do {
        lVar2 = 0;
        while( true ) {
          len = (int)lVar2;
          if (string[lVar2] == '\0') {
            if (lVar2 != 0) goto LAB_0012b3db;
            goto LAB_0012b3e0;
          }
          if (string[lVar2] == '\"') break;
          lVar2 = lVar2 + 1;
        }
        if (lVar2 != 0) {
          xmlBufferAdd(buf,string,len);
        }
        xmlBufferAdd(buf,(xmlChar *)"&quot;",6);
        string = string + lVar2 + 1;
      } while( true );
    }
    pxVar1 = "\'";
  }
  xmlBufferAdd(buf,pxVar1,-1);
  len = -1;
LAB_0012b3db:
  xmlBufferAdd(buf,string,len);
LAB_0012b3e0:
  xmlBufferAdd(buf,pxVar1,-1);
  return;
}

Assistant:

void
xmlBufferWriteQuotedString(xmlBufferPtr buf, const xmlChar *string) {
    const xmlChar *cur, *base;
    if (buf == NULL)
        return;
    if (xmlStrchr(string, '\"')) {
        if (xmlStrchr(string, '\'')) {
	    xmlBufferCCat(buf, "\"");
            base = cur = string;
            while(*cur != 0){
                if(*cur == '"'){
                    if (base != cur)
                        xmlBufferAdd(buf, base, cur - base);
                    xmlBufferAdd(buf, BAD_CAST "&quot;", 6);
                    cur++;
                    base = cur;
                }
                else {
                    cur++;
                }
            }
            if (base != cur)
                xmlBufferAdd(buf, base, cur - base);
	    xmlBufferCCat(buf, "\"");
	}
        else{
	    xmlBufferCCat(buf, "\'");
            xmlBufferCat(buf, string);
	    xmlBufferCCat(buf, "\'");
        }
    } else {
        xmlBufferCCat(buf, "\"");
        xmlBufferCat(buf, string);
        xmlBufferCCat(buf, "\"");
    }
}